

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O2

void glcts::anon_unknown_0::ShaderSourceFactory::streamUniformValidator
               (ostringstream *ret,Uniform *uniform,GLenum shader,char *outTemporary)

{
  string *psVar1;
  string *psVar2;
  UniformValue *this;
  pointer pUVar3;
  bool bVar4;
  int iVar5;
  ostream *poVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int column;
  char *pcVar7;
  size_t child;
  ulong uVar8;
  int arrayElem;
  long lVar9;
  string columnIndex;
  string absoluteF;
  undefined1 *local_1e8;
  undefined8 local_1e0;
  undefined1 local_1d8 [16];
  string local_1c8 [32];
  undefined1 *local_1a8;
  undefined8 local_1a0;
  undefined1 local_198 [360];
  
  bVar4 = DefOccurence::occurs(&uniform->declOccurence,shader);
  if (bVar4) {
    bVar4 = DefOccurence::occurs(&uniform->usageOccurence,shader);
    if (bVar4) {
      if ((uniform->type).baseType == 0) {
        lVar9 = 0;
        for (uVar8 = 0;
            pUVar3 = (uniform->childUniforms).
                     super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                     ._M_impl.super__Vector_impl_data._M_start,
            uVar8 < (ulong)(((long)(uniform->childUniforms).
                                   super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar3) /
                           0x1d8); uVar8 = uVar8 + 1) {
          streamUniformValidator
                    (ret,(Uniform *)((long)&(pUVar3->type).enumType + lVar9),shader,outTemporary);
          lVar9 = lVar9 + 0x1d8;
        }
      }
      else {
        psVar2 = &uniform->name;
        this = &uniform->value;
        psVar1 = &(uniform->type).refStrType;
        for (arrayElem = 0; arrayElem < (uniform->type).arraySize; arrayElem = arrayElem + 1) {
          for (column = 0; iVar5 = (uniform->type).size.second, column < iVar5; column = column + 1)
          {
            local_1e8 = local_1d8;
            local_1e0 = 0;
            local_1d8[0] = 0;
            if (1 < iVar5) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
              poVar6 = std::operator<<((ostream *)&local_1a8,"[");
              poVar6 = (ostream *)std::ostream::operator<<(poVar6,column);
              std::operator<<(poVar6,"]");
              std::__cxx11::stringbuf::str();
              std::__cxx11::string::operator=((string *)&local_1e8,local_1c8);
              std::__cxx11::string::~string(local_1c8);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
            }
            local_1a8 = local_198;
            local_1a0 = 0;
            local_198[0] = 0;
            if ((uniform->type).signedType == true) {
              std::__cxx11::string::assign((char *)&local_1a8);
            }
            if ((uniform->type).baseType == 0x82e6) {
              poVar6 = std::operator<<(&ret->super_basic_ostream<char,_std::char_traits<char>_>,
                                       "\n    if (any(greaterThan(");
              poVar6 = std::operator<<(poVar6,(string *)&local_1a8);
              poVar6 = std::operator<<(poVar6,"(texture(");
              std::operator<<(poVar6,(string *)psVar2);
              UniformType::streamArrayStr(&uniform->type,ret,arrayElem);
              poVar6 = std::operator<<(&ret->super_basic_ostream<char,_std::char_traits<char>_>,
                                       (string *)&local_1e8);
              std::operator<<(poVar6,", vec2(0.5)) - ");
              UniformValue::streamValue(this,ret,arrayElem,column);
              pcVar7 = " ), ";
LAB_00bd9605:
              poVar6 = std::operator<<(&ret->super_basic_ostream<char,_std::char_traits<char>_>,
                                       pcVar7);
              poVar6 = std::operator<<(poVar6,(string *)psVar1);
              iVar5 = 0x179c828;
              poVar6 = std::operator<<(poVar6,"(");
              iVar5 = UniformType::abs(&uniform->type,iVar5);
              poVar6 = std::operator<<(poVar6,(char *)CONCAT44(extraout_var,iVar5));
              pcVar7 = ")))) {";
            }
            else {
              if (1 < (uniform->type).size.first) {
                poVar6 = std::operator<<(&ret->super_basic_ostream<char,_std::char_traits<char>_>,
                                         "\n    if (any(greaterThan(");
                poVar6 = std::operator<<(poVar6,(string *)&local_1a8);
                poVar6 = std::operator<<(poVar6,"(");
                std::operator<<(poVar6,(string *)psVar2);
                UniformType::streamArrayStr(&uniform->type,ret,arrayElem);
                poVar6 = std::operator<<(&ret->super_basic_ostream<char,_std::char_traits<char>_>,
                                         (string *)&local_1e8);
                std::operator<<(poVar6," - ");
                UniformValue::streamValue(this,ret,arrayElem,column);
                pcVar7 = "), ";
                goto LAB_00bd9605;
              }
              poVar6 = std::operator<<(&ret->super_basic_ostream<char,_std::char_traits<char>_>,
                                       "\n    if (");
              poVar6 = std::operator<<(poVar6,(string *)&local_1a8);
              poVar6 = std::operator<<(poVar6,"(");
              std::operator<<(poVar6,(string *)psVar2);
              UniformType::streamArrayStr(&uniform->type,ret,arrayElem);
              std::operator<<(&ret->super_basic_ostream<char,_std::char_traits<char>_>," - ");
              UniformValue::streamValue(this,ret,arrayElem,0);
              poVar6 = std::operator<<(&ret->super_basic_ostream<char,_std::char_traits<char>_>,
                                       ") >");
              poVar6 = std::operator<<(poVar6,(string *)psVar1);
              iVar5 = 0x179c828;
              poVar6 = std::operator<<(poVar6,"(");
              iVar5 = UniformType::abs(&uniform->type,iVar5);
              poVar6 = std::operator<<(poVar6,(char *)CONCAT44(extraout_var_00,iVar5));
              pcVar7 = ")) {";
            }
            std::operator<<(poVar6,pcVar7);
            poVar6 = std::operator<<(&ret->super_basic_ostream<char,_std::char_traits<char>_>,
                                     "\n       ");
            poVar6 = std::operator<<(poVar6,"validationResult");
            std::operator<<(poVar6," = vec4 (1.0, 0.0, 0.0, 1.0);");
            std::operator<<(&ret->super_basic_ostream<char,_std::char_traits<char>_>,"\n    }");
            std::__cxx11::string::~string((string *)&local_1a8);
            std::__cxx11::string::~string((string *)&local_1e8);
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void streamUniformValidator(std::ostringstream& ret, const Uniform& uniform, GLenum shader,
									   const char* outTemporary)
	{
		if (uniform.declOccurence.occurs(shader) && uniform.usageOccurence.occurs(shader))
		{
			if (uniform.type.isStruct())
			{
				for (size_t child = 0; child < uniform.childUniforms.size(); child++)
				{
					streamUniformValidator(ret, uniform.childUniforms[child], shader, outTemporary);
				}
			}
			else
			{
				for (int arrayElement = 0; arrayElement < uniform.type.arraySize; arrayElement++)
				{
					for (int column = 0; column < uniform.type.getSize().second; column++)
					{
						std::string columnIndex;
						if (uniform.type.getSize().second > 1)
						{
							std::ostringstream str;
							str << "[" << column << "]";
							columnIndex = str.str();
						}
						std::string absoluteF;
						if (uniform.type.isSigned())
						{
							absoluteF = "abs";
						}

						if (uniform.type.getBaseType() == GL_SAMPLER)
						{
							ret << NL "    if (any(greaterThan(" << absoluteF << "(texture(" << uniform.getName();
							uniform.type.streamArrayStr(ret, arrayElement);
							ret << columnIndex << ", vec2(0.5)) - ";
							uniform.value.streamValue(ret, arrayElement, column);
							ret << " ), " << uniform.type.refStr() << "(" << uniform.type.abs() << ")))) {";
						}
						else if (uniform.type.getSize().first > 1)
						{
							ret << NL "    if (any(greaterThan(" << absoluteF << "(" << uniform.getName();
							uniform.type.streamArrayStr(ret, arrayElement);
							ret << columnIndex << " - ";
							uniform.value.streamValue(ret, arrayElement, column);
							ret << "), " << uniform.type.refStr() << "(" << uniform.type.abs() << ")))) {";
						}
						else
						{
							ret << NL "    if (" << absoluteF << "(" << uniform.getName();
							uniform.type.streamArrayStr(ret, arrayElement);
							ret << " - ";
							uniform.value.streamValue(ret, arrayElement);
							ret << ") >" << uniform.type.refStr() << "(" << uniform.type.abs() << ")) {";
						}
						ret << NL "       " << outTemporary << " = vec4 (1.0, 0.0, 0.0, 1.0);";
						ret << NL "    }";
					}
				}
			}
		}
	}